

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

HttpClient * __thiscall
kj::anon_unknown_31::NetworkHttpClient::getClient(NetworkHttpClient *this,Url *parsed)

{
  Network *pNVar1;
  iterator this_00;
  Url *this_01;
  bool bVar2;
  Network **ppNVar3;
  String *pSVar4;
  Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_> *params;
  Host *__y;
  pointer ppVar5;
  RefOrVoid<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient> pPVar6;
  undefined8 uVar7;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_Host>_>::value,_pair<iterator,_bool>_>
  _Var8;
  _Base_ptr local_1c0;
  byte local_199;
  undefined1 local_190 [24];
  Fault f_1;
  _Base_ptr local_130;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_Host>_>::value,_pair<iterator,_bool>_>
  insertResult;
  StringPtr nameRef;
  Host host;
  NetworkHttpClient *local_e0;
  StringPtr local_d8;
  Promise<kj::Own<kj::NetworkAddress>_> local_c8;
  undefined1 local_b8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3896:17),_kj::Own<kj::NetworkAddress>_>
  promise;
  Fault local_a0;
  Network *local_98;
  Network *_kj_result;
  Network *networkToUse;
  StringPtr local_80;
  _Self local_70;
  iterator iter;
  map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
  *hosts;
  Fault local_50;
  Fault f;
  undefined1 local_30 [7];
  bool isHttp;
  byte local_19;
  Url *pUStack_18;
  bool isHttps;
  Url *parsed_local;
  NetworkHttpClient *this_local;
  
  pUStack_18 = parsed;
  parsed_local = (Url *)this;
  StringPtr::StringPtr((StringPtr *)local_30,"https");
  local_19 = String::operator==(&parsed->scheme,(StringPtr *)local_30);
  this_01 = pUStack_18;
  StringPtr::StringPtr((StringPtr *)&f,"http");
  bVar2 = String::operator==(&this_01->scheme,(StringPtr *)&f);
  local_199 = 1;
  if (!bVar2) {
    local_199 = local_19;
  }
  if ((local_199 & 1) == 0) {
    _::Debug::Fault::Fault
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xf22,FAILED,"isHttp || isHttps","");
    _::Debug::Fault::fatal(&local_50);
  }
  if ((local_19 & 1) == 0) {
    local_1c0 = (_Base_ptr)&this->httpHosts;
  }
  else {
    local_1c0 = (_Base_ptr)&this->httpsHosts;
  }
  iter._M_node = local_1c0;
  StringPtr::StringPtr(&local_80,&pUStack_18->host);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
       ::find(local_1c0,&local_80);
  networkToUse = (Network *)
                 std::
                 map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 ::end((map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                        *)iter._M_node);
  bVar2 = std::operator==(&local_70,(_Self *)&networkToUse);
  if (bVar2) {
    _kj_result = this->network;
    if ((local_19 & 1) != 0) {
      local_98 = _::readMaybe<kj::Network>(&this->tlsNetwork);
      if (local_98 == (Network *)0x0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                  (&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xf34,FAILED,"tlsNetwork != nullptr",
                   "\"this HttpClient doesn\'t support HTTPS\"",
                   (char (*) [38])"this HttpClient doesn\'t support HTTPS");
        _::Debug::Fault::fatal(&local_a0);
      }
      ppNVar3 = mv<kj::Network*>(&local_98);
      promise.super_PromiseBase.node.ptr = (PromiseNode *)*ppNVar3;
      _kj_result = (Network *)promise.super_PromiseBase.node.ptr;
    }
    pNVar1 = _kj_result;
    StringPtr::StringPtr(&local_d8,&pUStack_18->host);
    uVar7 = 0x50;
    if ((local_19 & 1) != 0) {
      uVar7 = 0x1bb;
    }
    (**pNVar1->_vptr_Network)(&local_c8,pNVar1,local_d8.content.ptr,local_d8.content.size_,uVar7);
    local_e0 = this;
    Promise<kj::Own<kj::NetworkAddress>>::
    then<kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::_lambda(kj::Own<kj::NetworkAddress>)_1_,kj::_::PropagateException>
              ((Promise<kj::Own<kj::NetworkAddress>> *)local_b8,(Type *)&local_c8,
               (PropagateException *)&local_e0);
    Promise<kj::Own<kj::NetworkAddress>_>::~Promise(&local_c8);
    pSVar4 = mv<kj::String>(&pUStack_18->host);
    String::String((String *)&nameRef.content.size_,pSVar4);
    params = mv<kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>>
                       ((Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_> *)
                        local_b8);
    heap<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient,kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>>
              ((kj *)&host.name.content.disposer,params);
    StringPtr::StringPtr((StringPtr *)&insertResult.second,(String *)&nameRef.content.size_);
    this_00 = iter;
    __y = mv<kj::(anonymous_namespace)::NetworkHttpClient::Host>((Host *)&nameRef.content.size_);
    std::make_pair<kj::StringPtr&,kj::(anonymous_namespace)::NetworkHttpClient::Host>
              ((pair<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host> *)
               &stack0xfffffffffffffe98,(StringPtr *)&insertResult.second,__y);
    _Var8 = std::
            map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>
            ::insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host>>
                      ((map<kj::StringPtr,kj::(anonymous_namespace)::NetworkHttpClient::Host,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::NetworkHttpClient::Host>>>
                        *)this_00._M_node,
                       (pair<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host> *)
                       &stack0xfffffffffffffe98);
    f_1.exception = (Exception *)_Var8.first._M_node;
    insertResult.first._M_node._0_1_ = _Var8.second;
    local_130 = (_Base_ptr)f_1.exception;
    std::pair<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>::~pair
              ((pair<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host> *)
               &stack0xfffffffffffffe98);
    if (((byte)insertResult.first._M_node & 1) == 0) {
      _::Debug::Fault::Fault
                ((Fault *)(local_190 + 0x10),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xf44,FAILED,"insertResult.second","");
      _::Debug::Fault::fatal((Fault *)(local_190 + 0x10));
    }
    local_70._M_node = local_130;
    handleCleanup((NetworkHttpClient *)local_190,
                  (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                   *)this,iter);
    TaskSet::add(&this->tasks,(Promise<void> *)local_190);
    Promise<void>::~Promise((Promise<void> *)local_190);
    Host::~Host((Host *)&nameRef.content.size_);
    Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_>::~Promise
              ((Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>_> *)local_b8);
  }
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>
           ::operator->(&local_70);
  pPVar6 = Own<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::operator*
                     (&(ppVar5->second).client);
  return &pPVar6->super_HttpClient;
}

Assistant:

HttpClient& getClient(kj::Url& parsed) {
    bool isHttps = parsed.scheme == "https";
    bool isHttp = parsed.scheme == "http";
    KJ_REQUIRE(isHttp || isHttps);

    auto& hosts = isHttps ? httpsHosts : httpHosts;

    // Look for a cached client for this host.
    // TODO(perf): It would be nice to recognize when different hosts have the same address and
    //   reuse the same connection pool, but:
    //   - We'd need a reliable way to compare NetworkAddresses, e.g. .equals() and .hashCode().
    //     It's very Java... ick.
    //   - Correctly handling TLS would be tricky: we'd need to verify that the new hostname is
    //     on the certificate. When SNI is in use we might have to request an additional
    //     certificate (is that possible?).
    auto iter = hosts.find(parsed.host);

    if (iter == hosts.end()) {
      // Need to open a new connection.
      kj::Network* networkToUse = &network;
      if (isHttps) {
        networkToUse = &KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support HTTPS");
      }

      auto promise = networkToUse->parseAddress(parsed.host, isHttps ? 443 : 80)
          .then([this](kj::Own<kj::NetworkAddress> addr) {
        return kj::heap<NetworkAddressHttpClient>(
            timer, responseHeaderTable, kj::mv(addr), settings);
      });

      Host host {
        kj::mv(parsed.host),
        kj::heap<PromiseNetworkAddressHttpClient>(kj::mv(promise))
      };
      kj::StringPtr nameRef = host.name;

      auto insertResult = hosts.insert(std::make_pair(nameRef, kj::mv(host)));
      KJ_ASSERT(insertResult.second);
      iter = insertResult.first;

      tasks.add(handleCleanup(hosts, iter));
    }

    return *iter->second.client;
  }